

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::GlobalImport::~GlobalImport(GlobalImport *this)

{
  GlobalImport *this_local;
  
  ~GlobalImport(this);
  operator_delete(this);
  return;
}

Assistant:

explicit GlobalImport(string_view name = string_view())
      : ImportMixin<ExternalKind::Global>(), global(name) {}